

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O3

uint8_t * __thiscall pktalloc::Allocator::allocateFromNewWindow(Allocator *this,uint units)

{
  WindowHeader *this_00;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  void *pvVar4;
  uint8_t *puVar5;
  
  pvVar4 = calloc(1,0x10140);
  if (pvVar4 == (void *)0x0) {
    puVar5 = (uint8_t *)0x0;
  }
  else {
    uVar3 = (uint)pvVar4 & 0x1f;
    this_00 = (WindowHeader *)((long)pvVar4 + (0x20 - (ulong)uVar3));
    *(char *)((long)pvVar4 + (0x1f - (ulong)uVar3)) = (char)uVar3;
    CustomBitSet<2048U>::SetRange((CustomBitSet<2048U> *)this_00,0,units);
    *(uint *)((long)pvVar4 + (0x120 - (ulong)uVar3)) = 0x800 - units;
    *(uint *)((long)pvVar4 + (0x124 - (ulong)uVar3)) = units;
    *(undefined1 *)((long)pvVar4 + (300 - (ulong)uVar3)) = 0;
    *(undefined4 *)((long)pvVar4 + (0x128 - (ulong)uVar3)) = 0xffffffff;
    uVar1 = (this->PreferredWindows).Size;
    bVar2 = LightVector<pktalloc::Allocator::WindowHeader_*>::SetSize_Copy
                      (&this->PreferredWindows,uVar1 + 1);
    if (bVar2) {
      (this->PreferredWindows).DataPtr[uVar1] = this_00;
    }
    *(WindowHeader **)((long)pvVar4 + (0x140 - (ulong)uVar3)) = this_00;
    *(uint *)((long)pvVar4 + (0x148 - (ulong)uVar3)) = units;
    puVar5 = (uint8_t *)((long)pvVar4 + (0x160 - (ulong)uVar3));
  }
  return puVar5;
}

Assistant:

uint8_t* Allocator::allocateFromNewWindow(unsigned units)
{
    ALLOC_DEBUG_INTEGRITY_CHECK();

    uint8_t* headerStart = SIMDSafeAllocate(kWindowSizeBytes);
    if (!headerStart) {
        return nullptr; // Allocation failure
    }

    // Update window header
    WindowHeader* window = (WindowHeader*)headerStart;
    window->Used.ClearAll();
    window->Used.SetRange(0, units);
    window->FreeUnitCount = kWindowMaxUnits - units;
    window->ResumeScanOffset = units;
    window->Preallocated = false;
    PKTALLOC_DEBUG_ASSERT(PreferredWindows.GetSize() == 0);
    window->FullListIndex = kNotInFullList;
    PreferredWindows.Append(window);

    // Carve out region
    AllocationHeader* regionHeader = (AllocationHeader*)(headerStart + kWindowHeaderBytes);
#ifdef PKTALLOC_DEBUG
    regionHeader->Canary = AllocationHeader::kCanaryExpected;
#endif // PKTALLOC_DEBUG
    regionHeader->Header = window;
    regionHeader->UsedUnits = units;

    uint8_t* data = (uint8_t*)regionHeader + kUnitSize;
#ifdef PKTALLOC_SCRUB_MEMORY
    memset(data, 0, (units - 1) * kUnitSize);
#endif // PKTALLOC_SCRUB_MEMORY
    PKTALLOC_DEBUG_ASSERT((uintptr_t)data % kUnitSize == 0);

    ALLOC_DEBUG_INTEGRITY_CHECK();

    return data;
}